

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

double __thiscall sophia_interface::twoback(sophia_interface *this,double x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = 0.0;
  if (0.4 <= x) {
    dVar1 = pow((x + -0.4) / 0.19999999999999996,0.9999999999999996);
    dVar2 = pow(x / 0.6,-2.9999999999999996);
    dVar1 = dVar2 * dVar1 * 37.7;
  }
  return dVar1;
}

Assistant:

double sophia_interface::twoback(double x) {
// TWO PION PRODUCTION
    return 37.7 * Pl(x, 0.4, 0.6, 2.);
}